

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O2

void __thiscall cmXMLWriter::ProcessingInstruction(cmXMLWriter *this,char *target,char *data)

{
  ostream *poVar1;
  
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)(this->IsContent ^ 1));
  poVar1 = std::operator<<(this->Output,"<?");
  poVar1 = std::operator<<(poVar1,target);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,data);
  std::operator<<(poVar1,"?>");
  return;
}

Assistant:

void cmXMLWriter::ProcessingInstruction(const char* target, const char* data)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << "<?" << target << ' ' << data << "?>";
}